

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::TiledInputFile::Data::Data(Data *this,int numThreads)

{
  int in_ESI;
  long in_RDI;
  size_type __new_size;
  vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  *this_00;
  TileOffsets *unaff_retaddr;
  LevelMode r;
  float in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  int in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  float in_stack_fffffffffffffff0;
  long lVar1;
  
  lVar1 = in_RDI;
  std::mutex::mutex((mutex *)0x19863c);
  Imath_2_5::Vec2<float>::Vec2((Vec2<float> *)&stack0xffffffffffffffec,0.0,0.0);
  r = ONE_LEVEL;
  Header::Header((Header *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)in_stack_ffffffffffffffec
                 ,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                 (V2f *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 in_stack_ffffffffffffffd4,INCREASING_Y,(Compression)((ulong)in_RDI >> 0x20));
  TileDescription::TileDescription((TileDescription *)(in_RDI + 0x60),0x20,0x20,r,r);
  __new_size = in_RDI + 0x78;
  FrameBuffer::FrameBuffer((FrameBuffer *)0x1986c0);
  *(undefined8 *)(in_RDI + 200) = 0;
  *(undefined8 *)(in_RDI + 0xd0) = 0;
  this_00 = (vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
             *)(in_RDI + 0xd8);
  TileOffsets::TileOffsets
            (unaff_retaddr,(LevelMode)((ulong)lVar1 >> 0x20),(int)lVar1,in_ESI,
             (int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  std::
  vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
  ::vector((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
            *)0x19870f);
  *(undefined4 *)(in_RDI + 0x130) = 0xffffffff;
  *(undefined1 *)(in_RDI + 0x134) = 0;
  *(int *)(in_RDI + 0x138) = in_ESI;
  *(undefined8 *)(in_RDI + 0x140) = 0;
  std::
  vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ::vector((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            *)0x198753);
  *(undefined1 *)(in_RDI + 0x168) = 0;
  *(undefined8 *)(in_RDI + 0x170) = 0;
  *(undefined1 *)(in_RDI + 0x178) = 0;
  std::max<int>((int *)&stack0xffffffffffffffd8,(int *)&stack0xffffffffffffffd4);
  std::
  vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ::resize(this_00,__new_size);
  return;
}

Assistant:

TiledInputFile::Data::Data (int numThreads):
    numXTiles (0),
    numYTiles (0),
    partNumber (-1),
    multiPartBackwardSupport(false),
    numThreads(numThreads),
    multiPartFile(nullptr),
    memoryMapped(false),
    _streamData(NULL),
    _deleteStream(false)
{
    //
    // We need at least one tileBuffer, but if threading is used,
    // to keep n threads busy we need 2*n tileBuffers
    //

    tileBuffers.resize (max (1, 2 * numThreads));
}